

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t vfmatch(scanner_t *scanner,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  int base_00;
  char *pcVar4;
  long *local_158;
  undefined8 *local_140;
  undefined8 *local_128;
  undefined8 *local_110;
  size_t *local_f8;
  undefined8 *local_e0;
  undefined8 *local_c8;
  undefined8 *local_b0;
  token_type_t local_84;
  int base;
  token_type_t tok_type;
  memptr token;
  int case_sensitive;
  int stat;
  size_t save_pos;
  uri_type *uri_ptr;
  int *int_ptr;
  memptr temp_str;
  memptr *str_ptr;
  char *pcStack_30;
  parse_status_t status;
  char *fmt_ptr;
  char c;
  __va_list_tag *argp_local;
  char *fmt_local;
  scanner_t *scanner_local;
  
  token.length._0_4_ = 1;
  if (scanner == (scanner_t *)0x0) {
    __assert_fail("scanner != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3c0,
                  "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
  }
  if (fmt != (char *)0x0) {
    sVar3 = scanner->cursor;
    str_ptr._4_4_ = PARSE_OK;
    pcStack_30 = fmt;
    do {
      while( true ) {
        pcVar4 = pcStack_30 + 1;
        cVar1 = *pcStack_30;
        if (cVar1 == '\0' || str_ptr._4_4_ != PARSE_OK) {
          if (str_ptr._4_4_ != PARSE_OK) {
            scanner->cursor = sVar3;
          }
          return str_ptr._4_4_;
        }
        if (cVar1 == '%') break;
        pcStack_30 = pcVar4;
        if (cVar1 == '\t') {
          str_ptr._4_4_ = scanner_get_token(scanner,(memptr *)&base,&local_84);
          if ((str_ptr._4_4_ == PARSE_OK) && (local_84 != TT_WHITESPACE)) {
            str_ptr._4_4_ = PARSE_NO_MATCH;
          }
        }
        else if (cVar1 == ' ') {
          str_ptr._4_4_ = skip_lws(scanner);
        }
        else {
          str_ptr._4_4_ = match_char(scanner,cVar1,(int)token.length);
        }
      }
      pcStack_30 = pcStack_30 + 2;
      cVar1 = *pcVar4;
      switch(cVar1) {
      case ' ':
      case '%':
        str_ptr._4_4_ = match_char(scanner,cVar1,(int)token.length);
        break;
      default:
        __assert_fail("0",".upnp/src/genlib/net/http/httpparser.c",0x43a,
                      "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
      case '0':
        if ((scanner->cursor == scanner->msg->length) &&
           (scanner->msg->buf[scanner->cursor] == '\0')) {
          str_ptr._4_4_ = PARSE_OK;
        }
        else {
          str_ptr._4_4_ = PARSE_NO_MATCH;
        }
        break;
      case 'L':
        uVar2 = argp->gp_offset;
        if (uVar2 < 0x29) {
          local_128 = (undefined8 *)((long)(int)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          local_128 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = local_128 + 1;
        }
        temp_str.length = *local_128;
        if ((memptr *)temp_str.length == (memptr *)0x0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x403,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        str_ptr._4_4_ = read_until_crlf(scanner,(memptr *)temp_str.length);
        break;
      case 'P':
        uVar2 = argp->gp_offset;
        if (uVar2 < 0x29) {
          local_158 = (long *)((long)(int)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          local_158 = (long *)argp->overflow_arg_area;
          argp->overflow_arg_area = local_158 + 1;
        }
        if ((undefined4 *)*local_158 == (undefined4 *)0x0) {
          __assert_fail("int_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x429,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        *(undefined4 *)*local_158 = (int)scanner->cursor;
        break;
      case 'R':
        uVar2 = argp->gp_offset;
        if (uVar2 < 0x29) {
          local_b0 = (undefined8 *)((long)(int)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          local_b0 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = local_b0 + 1;
        }
        temp_str.length = *local_b0;
        if ((memptr *)temp_str.length == (memptr *)0x0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3cd,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        str_ptr._4_4_ = match_raw_value(scanner,(memptr *)temp_str.length);
        break;
      case 'S':
      case 'U':
        if (cVar1 == 'S') {
          uVar2 = argp->gp_offset;
          if (uVar2 < 0x29) {
            local_f8 = (size_t *)((long)(int)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            local_f8 = (size_t *)argp->overflow_arg_area;
            argp->overflow_arg_area = local_f8 + 1;
          }
          temp_str.length = *local_f8;
        }
        else {
          temp_str.length = (size_t)&int_ptr;
        }
        if (temp_str.length == 0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3f3,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        str_ptr._4_4_ = match_non_ws_string(scanner,(memptr *)temp_str.length);
        if ((cVar1 == 'U') && (str_ptr._4_4_ == PARSE_OK)) {
          uVar2 = argp->gp_offset;
          if (uVar2 < 0x29) {
            local_110 = (undefined8 *)((long)(int)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            local_110 = (undefined8 *)argp->overflow_arg_area;
            argp->overflow_arg_area = local_110 + 1;
          }
          if ((uri_type *)*local_110 == (uri_type *)0x0) {
            __assert_fail("uri_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3f8,
                          "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)"
                         );
          }
          token.length._4_4_ =
               parse_uri(*(char **)temp_str.length,*(size_t *)(temp_str.length + 8),
                         (uri_type *)*local_110);
          if (token.length._4_4_ != 1) {
            str_ptr._4_4_ = PARSE_NO_MATCH;
          }
        }
        break;
      case 'c':
        str_ptr._4_4_ = scanner_get_token(scanner,(memptr *)&base,&local_84);
        if ((str_ptr._4_4_ == PARSE_OK) && (local_84 != TT_CRLF)) {
          str_ptr._4_4_ = PARSE_NO_MATCH;
        }
        break;
      case 'd':
      case 'x':
        uVar2 = argp->gp_offset;
        if (uVar2 < 0x29) {
          local_e0 = (undefined8 *)((long)(int)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          local_e0 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = local_e0 + 1;
        }
        if ((int *)*local_e0 == (int *)0x0) {
          __assert_fail("int_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",1000,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        base_00 = 0x10;
        if (cVar1 == 'd') {
          base_00 = 10;
        }
        str_ptr._4_4_ = match_int(scanner,base_00,(int *)*local_e0);
        break;
      case 'i':
        token.length._0_4_ = 0;
        break;
      case 'n':
        token.length._0_4_ = 1;
        break;
      case 'q':
        uVar2 = argp->gp_offset;
        if (uVar2 < 0x29) {
          local_140 = (undefined8 *)((long)(int)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          local_140 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = local_140 + 1;
        }
        temp_str.length = *local_140;
        str_ptr._4_4_ = scanner_get_token(scanner,(memptr *)temp_str.length,&local_84);
        if ((str_ptr._4_4_ == PARSE_OK) && (local_84 != TT_QUOTEDSTRING)) {
          str_ptr._4_4_ = PARSE_NO_MATCH;
        }
        break;
      case 's':
        uVar2 = argp->gp_offset;
        if (uVar2 < 0x29) {
          local_c8 = (undefined8 *)((long)(int)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          local_c8 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = local_c8 + 1;
        }
        temp_str.length = *local_c8;
        if ((memptr *)temp_str.length == (memptr *)0x0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3d2,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        str_ptr._4_4_ = scanner_get_token(scanner,(memptr *)temp_str.length,&local_84);
        if ((str_ptr._4_4_ == PARSE_OK) && (local_84 != TT_IDENTIFIER)) {
          str_ptr._4_4_ = PARSE_NO_MATCH;
        }
        break;
      case 'w':
        str_ptr._4_4_ = scanner_get_token(scanner,(memptr *)&base,&local_84);
        if ((str_ptr._4_4_ == PARSE_OK) && (local_84 != TT_WHITESPACE)) {
          scanner->cursor = scanner->cursor - (long)token.buf;
        }
      }
    } while( true );
  }
  __assert_fail("fmt != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3c1,
                "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
}

Assistant:

static parse_status_t vfmatch(scanner_t *scanner, const char *fmt, va_list argp)
{
	char c;
	const char *fmt_ptr = fmt;
	parse_status_t status;
	memptr *str_ptr;
	memptr temp_str;
	int *int_ptr;
	uri_type *uri_ptr;
	size_t save_pos;
	int stat;
	int case_sensitive = 1;
	memptr token;
	token_type_t tok_type;
	int base;

	assert(scanner != NULL);
	assert(fmt != NULL);

	/* save scanner pos; to aid error recovery */
	save_pos = scanner->cursor;

	status = PARSE_OK;
	while ((c = *fmt_ptr++) && (status == (parse_status_t)PARSE_OK)) {
		if (c == '%') {
			c = *fmt_ptr++;
			switch (c) {
			case 'R': /* raw value */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = match_raw_value(scanner, str_ptr);
				break;
			case 's': /* simple identifier */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = scanner_get_token(
					scanner, str_ptr, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_IDENTIFIER) {
					/* not an identifier */
					status = PARSE_NO_MATCH;
				}
				break;
			case 'c': /* crlf */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type != (token_type_t)TT_CRLF) {
					/* not CRLF token */
					status = PARSE_NO_MATCH;
				}
				break;
			case 'd': /* integer */
			case 'x': /* hex number */
				int_ptr = va_arg(argp, int *);
				assert(int_ptr != NULL);
				base = c == 'd' ? 10 : 16;
				status = match_int(scanner, base, int_ptr);
				break;
			case 'S': /* non-whitespace string */
			case 'U': /* uri */
				if (c == 'S') {
					str_ptr = va_arg(argp, memptr *);
				} else {
					str_ptr = &temp_str;
				}
				assert(str_ptr != NULL);
				status = match_non_ws_string(scanner, str_ptr);
				if (c == 'U' &&
					status == (parse_status_t)PARSE_OK) {
					uri_ptr = va_arg(argp, uri_type *);
					assert(uri_ptr != NULL);
					stat = parse_uri(str_ptr->buf,
						str_ptr->length,
						uri_ptr);
					if (stat != HTTP_SUCCESS) {
						status = PARSE_NO_MATCH;
					}
				}
				break;
			case 'L': /* string till eol */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = read_until_crlf(scanner, str_ptr);
				break;
			case ' ': /* match space */
			case '%': /* match percentage symbol */
				status = match_char(scanner, c, case_sensitive);
				break;
			case 'n': /* case-sensitive match */
				case_sensitive = 1;
				break;
			case 'i': /* ignore case */
				case_sensitive = 0;
				break;
			case 'q': /* quoted string */
				str_ptr = (memptr *)va_arg(argp, memptr *);
				status = scanner_get_token(
					scanner, str_ptr, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_QUOTEDSTRING) {
					status = PARSE_NO_MATCH; /* not a quoted
								    string */
				}
				break;
			case 'w':
				/* optional whitespace */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_WHITESPACE) {
					/* restore non-whitespace token */
					scanner->cursor -= token.length;
				}
				break;
			case 'P':
				/* current pos of scanner */
				int_ptr = va_arg(argp, int *);
				assert(int_ptr != NULL);
				*int_ptr = (int)scanner->cursor;
				break;
				/* valid only in matchstr() */
			case '0':
				/* end of msg? */
				/* check that we are 1 beyond last char */
				if (scanner->cursor == scanner->msg->length &&
					scanner->msg->buf[scanner->cursor] ==
						'\0') {
					status = PARSE_OK;
				} else {
					status = PARSE_NO_MATCH;
				}
				break;
			default:
				/* unknown option */
				assert(0);
			}
		} else {
			switch (c) {
			case ' ': /* LWS* */
				status = skip_lws(scanner);
				break;
			case '\t': /* Whitespace */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_WHITESPACE) {
					/* not whitespace token */
					status = PARSE_NO_MATCH;
				}
				break;
			default: /* match characters */
			{
				status = match_char(scanner, c, case_sensitive);
			}
			}
		}
	}
	if (status != (parse_status_t)PARSE_OK) {
		/* on error, restore original scanner pos */
		scanner->cursor = save_pos;
	}

	return status;
}